

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O1

void __thiscall
TTD::ExecutionInfoManager::GetLastExceptionTimeAndPositionForDebugger
          (ExecutionInfoManager *this,TTDebuggerSourceLocation *sourceLocation)

{
  sourceLocation->m_sourceScriptLogId = (this->m_lastExceptionLocation).m_sourceScriptLogId;
  sourceLocation->m_bpId = (this->m_lastExceptionLocation).m_bpId;
  sourceLocation->m_etime = (this->m_lastExceptionLocation).m_etime;
  sourceLocation->m_ftime = (this->m_lastExceptionLocation).m_ftime;
  sourceLocation->m_ltime = (this->m_lastExceptionLocation).m_ltime;
  sourceLocation->m_topLevelBodyId = (this->m_lastExceptionLocation).m_topLevelBodyId;
  sourceLocation->m_functionLine = (this->m_lastExceptionLocation).m_functionLine;
  sourceLocation->m_functionColumn = (this->m_lastExceptionLocation).m_functionColumn;
  sourceLocation->m_line = (this->m_lastExceptionLocation).m_line;
  sourceLocation->m_column = (this->m_lastExceptionLocation).m_column;
  return;
}

Assistant:

void ExecutionInfoManager::GetLastExceptionTimeAndPositionForDebugger(TTDebuggerSourceLocation& sourceLocation) const
    {
        //If no exception then this will also clear sourceLocation
        sourceLocation.SetLocationCopy(this->m_lastExceptionLocation);
    }